

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

Expression * __thiscall MathInterpreter::interpret(MathInterpreter *this,string *input_arg)

{
  pointer pcVar1;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Expression *pEVar2;
  _List_node_base *p_Var3;
  string local_40;
  
  pcVar1 = (input_arg->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + input_arg->_M_string_length);
  separateInput(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  fromInfixToPostfix(this);
  pEVar2 = fromStringToExpression(this);
  this_00 = &this->input->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  if (this_00 !=
      (_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(this_00);
  }
  operator_delete(this_00,0x18);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3->_M_prev = p_Var3;
  p_Var3->_M_next = p_Var3;
  p_Var3[1]._M_next = (_List_node_base *)0x0;
  this->input = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)p_Var3;
  return pEVar2;
}

Assistant:

Expression *MathInterpreter::interpret(string input_arg) {
  this->separateInput(input_arg);
  this->fromInfixToPostfix();
  Expression *e = this->fromStringToExpression();
  delete this->input;
  this->input = new list<string>();
  return e;
}